

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::get_subpass_meta_for_render_pass_hash
          (Impl *this,Hash render_pass_hash,uint32_t subpass,SubpassMeta *meta)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  bool bVar3;
  uint uVar4;
  _Hash_node_base *p_Var5;
  byte bVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  
  uVar1 = (this->render_pass_hash_to_subpass_meta)._M_h._M_bucket_count;
  uVar7 = render_pass_hash % uVar1;
  p_Var2 = (this->render_pass_hash_to_subpass_meta)._M_h._M_buckets[uVar7];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var2->_M_nxt, p_Var8 = p_Var2,
     p_Var9[1]._M_nxt != (_Hash_node_base *)render_pass_hash)) {
    while (p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var8 = p_Var9, p_Var9 = p_Var5, p_Var5[1]._M_nxt == (_Hash_node_base *)render_pass_hash)
         ) goto LAB_0016ce5d;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0016ce5d:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var8->_M_nxt;
  }
  if ((p_Var5 == (_Hash_node_base *)0x0) || (*(uint *)((long)&p_Var5[2]._M_nxt + 4) <= subpass)) {
    bVar3 = false;
  }
  else {
    if (subpass < 0x10) {
      uVar4 = *(uint *)&p_Var5[2]._M_nxt;
    }
    else {
      uVar4 = *(uint *)((long)&(p_Var5[3]._M_nxt)->_M_nxt + (ulong)(subpass - 0x10 >> 4) * 4);
    }
    bVar6 = (byte)(uVar4 >> ((char)subpass * '\x02' & 0x1fU));
    meta->uses_color = (bool)(bVar6 & 1);
    meta->uses_depth_stencil = (bool)(bVar6 >> 1 & 1);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool StateRecorder::Impl::get_subpass_meta_for_render_pass_hash(Hash render_pass_hash, uint32_t subpass,
                                                                SubpassMeta *meta) const
{
	auto itr = render_pass_hash_to_subpass_meta.find(render_pass_hash);
	if (itr != render_pass_hash_to_subpass_meta.end() && subpass < itr->second.subpass_count)
	{
		uint32_t mask;
		if (subpass < 16)
			mask = itr->second.embedded >> (2 * subpass);
		else
			mask = itr->second.fallback[(subpass - 16) / 16] >> (2 * (subpass & 15));
		meta->uses_color = (mask & 1) != 0;
		meta->uses_depth_stencil = (mask & 2) != 0;
		return true;
	}
	else
		return false;
}